

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O2

void __thiscall QKmsDevice::~QKmsDevice(QKmsDevice *this)

{
  this->_vptr_QKmsDevice = (_func_int **)&PTR__QKmsDevice_00122450;
  threadLocalAtomicReset(this);
  QArrayDataPointer<QKmsPlane>::~QArrayDataPointer(&(this->m_planes).d);
  QThreadStorageData::~QThreadStorageData(&(this->m_atomicReqs).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_path).d);
  return;
}

Assistant:

QKmsDevice::~QKmsDevice()
{
#if QT_CONFIG(drm_atomic)
    threadLocalAtomicReset();
#endif
}